

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgtAig.c
# Opt level: O3

void Cgt_ManConstructCare(Aig_Man_t *pNew,Aig_Man_t *pCare,Vec_Vec_t *vSuppsInv,Vec_Ptr_t *vLeaves)

{
  int iVar1;
  int *piVar2;
  void *pvVar3;
  void *pvVar4;
  ulong uVar5;
  long lVar6;
  Aig_Obj_t *pAVar7;
  long lVar8;
  
  Aig_ManIncrementTravId(pCare);
  if (0 < vLeaves->nSize) {
    lVar6 = 0;
    do {
      piVar2 = (int *)vLeaves->pArray[lVar6];
      if (0xfffffffd < (piVar2[6] & 7U) - 7) goto LAB_008dda5c;
      iVar1 = *piVar2;
      if (((long)iVar1 < 0) || (pCare->vCis->nSize <= iVar1)) {
LAB_008dda3d:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar3 = pCare->vCis->pArray[iVar1];
      *(int *)((long)pvVar3 + 0x20) = pCare->nTravIds;
      *(undefined8 *)((long)pvVar3 + 0x28) = *(undefined8 *)(piVar2 + 10);
      lVar6 = lVar6 + 1;
      uVar5 = (ulong)vLeaves->nSize;
    } while (lVar6 < (long)uVar5);
    if (0 < vLeaves->nSize) {
      lVar6 = 0;
      do {
        if (0xfffffffd < (*(uint *)((long)vLeaves->pArray[lVar6] + 0x18) & 7) - 7) {
LAB_008dda5c:
          __assert_fail("!Aig_ObjIsNode(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                        ,0x11d,"int Aig_ObjCioId(Aig_Obj_t *)");
        }
        iVar1 = *vLeaves->pArray[lVar6];
        if (((long)iVar1 < 0) || (vSuppsInv->nSize <= iVar1)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecVec.h"
                        ,0x116,"Vec_Int_t *Vec_VecEntryInt(Vec_Vec_t *, int)");
        }
        pvVar3 = vSuppsInv->pArray[iVar1];
        if (0 < *(int *)((long)pvVar3 + 4)) {
          lVar8 = 0;
          do {
            iVar1 = *(int *)(*(long *)((long)pvVar3 + 8) + lVar8 * 4);
            if (((long)iVar1 < 0) || (pCare->vCos->nSize <= iVar1)) goto LAB_008dda3d;
            pvVar4 = pCare->vCos->pArray[iVar1];
            if (*(int *)((long)pvVar4 + 0x20) != pCare->nTravIds) {
              *(int *)((long)pvVar4 + 0x20) = pCare->nTravIds;
              pAVar7 = (Aig_Obj_t *)(*(ulong *)((long)pvVar4 + 8) & 0xfffffffffffffffe);
              if (pCare->pConst1 != pAVar7) {
                pAVar7 = Cgt_ManConstructCare_rec(pCare,pAVar7,pNew);
                if (pAVar7 != (Aig_Obj_t *)0x0) {
                  Aig_ObjCreateCo(pNew,(Aig_Obj_t *)
                                       ((ulong)((uint)*(undefined8 *)((long)pvVar4 + 8) & 1) ^
                                       (ulong)pAVar7));
                }
              }
            }
            lVar8 = lVar8 + 1;
          } while (lVar8 < *(int *)((long)pvVar3 + 4));
          uVar5 = (ulong)(uint)vLeaves->nSize;
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < (int)uVar5);
    }
  }
  return;
}

Assistant:

void Cgt_ManConstructCare( Aig_Man_t * pNew, Aig_Man_t * pCare, Vec_Vec_t * vSuppsInv, Vec_Ptr_t * vLeaves )
{
    Vec_Int_t * vOuts;
    Aig_Obj_t * pLeaf, * pPi, * pPo, * pObjAig;
    int i, k, iOut;
    // go through the PIs of the partition
    // label the corresponding PIs of the care set
    Aig_ManIncrementTravId( pCare );
    Vec_PtrForEachEntry( Aig_Obj_t *, vLeaves, pLeaf, i )
    {
        pPi = Aig_ManCi( pCare, Aig_ObjCioId(pLeaf) );
        Aig_ObjSetTravIdCurrent( pCare, pPi );
        pPi->pData = pLeaf->pData;
    }
    // construct the constraints
    Vec_PtrForEachEntry( Aig_Obj_t *, vLeaves, pLeaf, i )
    {
        vOuts = Vec_VecEntryInt( vSuppsInv, Aig_ObjCioId(pLeaf) );
        Vec_IntForEachEntry( vOuts, iOut, k )
        {
            pPo = Aig_ManCo( pCare, iOut );
            if ( Aig_ObjIsTravIdCurrent( pCare, pPo ) )
                continue;
            Aig_ObjSetTravIdCurrent( pCare, pPo );
            if ( Aig_ObjFanin0(pPo) == Aig_ManConst1(pCare) )
                continue;
            pObjAig = Cgt_ManConstructCare_rec( pCare, Aig_ObjFanin0(pPo), pNew );
            if ( pObjAig == NULL )
                continue;
            pObjAig = Aig_NotCond( pObjAig, Aig_ObjFaninC0(pPo) );
            Aig_ObjCreateCo( pNew, pObjAig );
        }
    }
}